

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR xpath_re_match(lyxp_set **args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  int iVar1;
  lyxp_set *plVar2;
  ushort *puVar3;
  ly_bool lVar4;
  LY_ERR ret__;
  LY_ERR LVar5;
  undefined8 *__ptr;
  void *pvVar6;
  char *pcVar7;
  size_t str_len;
  uint32_t uVar8;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  undefined4 uVar12;
  ly_ctx *plVar13;
  ly_err_item *err;
  ly_err_item *local_30;
  
  plVar2 = *args;
  if ((options & 0x1c) == 0) {
    LVar5 = lyxp_set_cast(plVar2,LYXP_SET_STRING);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    LVar5 = lyxp_set_cast(args[1],LYXP_SET_STRING);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    __ptr = (undefined8 *)malloc(0x10);
    if (__ptr == (undefined8 *)0x0) {
      ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xpath_re_match");
      return LY_EMEM;
    }
    *__ptr = 1;
    pvVar6 = calloc(1,0x40);
    __ptr[1] = pvVar6;
    if ((set->field_10).cur_node != (lyd_node *)0x0) {
      ly_log_location((lysc_node *)0x0,(set->field_10).cur_node,(char *)0x0,(ly_in *)0x0);
    }
    LVar5 = lys_compile_type_pattern_check
                      (set->ctx,(args[1]->val).str,(pcre2_code_8 **)((long)pvVar6 + 8));
    if ((set->field_10).cur_node != (lyd_node *)0x0) {
      ly_log_location_revert(0,1,0,0);
    }
    if (LVar5 != LY_SUCCESS) {
      free(__ptr);
      return LVar5;
    }
    pcVar7 = ((*args)->val).str;
    str_len = strlen(pcVar7);
    LVar5 = lyplg_type_validate_patterns((lysc_pattern **)(__ptr + 1),pcVar7,str_len,&local_30);
    pcre2_code_free_8(*(undefined8 *)(__ptr[1] + 8));
    free((void *)__ptr[1]);
    free(__ptr);
    if (LVar5 == LY_SUCCESS) {
      lyxp_set_free_content(set);
      set->type = LYXP_SET_BOOLEAN;
      (set->val).bln = '\x01';
    }
    else {
      if (LVar5 != LY_EVALID) {
        ly_err_print(set->ctx,local_30);
        ly_err_free(local_30);
        return LVar5;
      }
      ly_err_free(local_30);
      lyxp_set_free_content(set);
      set->type = LYXP_SET_BOOLEAN;
      (set->val).bln = '\0';
    }
  }
  else {
    if (plVar2->type == LYXP_SET_SCNODE_SET) {
      uVar8 = plVar2->used;
      do {
        uVar8 = uVar8 - 1;
        if (*(int *)((long)(plVar2->val).nodes + (ulong)uVar8 * 0x18 + 0xc) == 2) {
          puVar3 = *(ushort **)((long)(plVar2->val).nodes + (ulong)uVar8 * 0x18);
          if (puVar3 == (ushort *)0x0) break;
          if ((*puVar3 & 0xc) == 0) {
            plVar13 = set->ctx;
            pcVar7 = lys_nodetype2str(*puVar3);
            pcVar10 = "Argument #1 of %s is a %s node \"%s\".";
          }
          else {
            lVar4 = warn_is_string_type(*(lysc_type **)(puVar3 + 0x30));
            if (lVar4 != '\0') break;
            plVar13 = set->ctx;
            pcVar7 = *(char **)(puVar3 + 0x14);
            pcVar10 = "Argument #1 of %s is node \"%s\", not of string-type.";
          }
          ly_log(plVar13,LY_LLWRN,LY_SUCCESS,pcVar10,"xpath_re_match",pcVar7);
          break;
        }
      } while (uVar8 != 0);
    }
    plVar2 = args[1];
    if (plVar2->type == LYXP_SET_SCNODE_SET) {
      uVar9 = plVar2->used;
      do {
        uVar9 = uVar9 - 1;
        if (*(int *)((long)(plVar2->val).nodes + (ulong)uVar9 * 0x18 + 0xc) == 2) {
          puVar3 = *(ushort **)((long)(plVar2->val).nodes + (ulong)uVar9 * 0x18);
          if (puVar3 == (ushort *)0x0) break;
          if ((*puVar3 & 0xc) == 0) {
            plVar13 = set->ctx;
            pcVar7 = lys_nodetype2str(*puVar3);
            pcVar10 = "Argument #2 of %s is a %s node \"%s\".";
          }
          else {
            lVar4 = warn_is_string_type(*(lysc_type **)(puVar3 + 0x30));
            if (lVar4 != '\0') break;
            plVar13 = set->ctx;
            pcVar7 = *(char **)(puVar3 + 0x14);
            pcVar10 = "Argument #2 of %s is node \"%s\", not of string-type.";
          }
          ly_log(plVar13,LY_LLWRN,LY_SUCCESS,pcVar10,"xpath_re_match",pcVar7);
          break;
        }
      } while (uVar9 != 0);
    }
    uVar9 = set->used;
    if ((ulong)uVar9 != 0) {
      lVar11 = 0;
      do {
        iVar1 = *(int *)((long)&((set->val).nodes)->pos + lVar11);
        if (iVar1 == 2) {
          uVar12 = 1;
LAB_001b16ae:
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar11) = uVar12;
        }
        else if (iVar1 == -2) {
          uVar12 = 0xffffffff;
          goto LAB_001b16ae;
        }
        lVar11 = lVar11 + 0x18;
      } while ((ulong)uVar9 * 0x18 != lVar11);
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_re_match(struct lyxp_set **args, uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    struct lysc_pattern **patterns = NULL, **pattern;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;
    struct ly_err_item *err;

    if (options & LYXP_SCNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }

        if ((args[1]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    rc = lyxp_set_cast(args[0], LYXP_SET_STRING);
    LY_CHECK_RET(rc);
    rc = lyxp_set_cast(args[1], LYXP_SET_STRING);
    LY_CHECK_RET(rc);

    LY_ARRAY_NEW_RET(set->ctx, patterns, pattern, LY_EMEM);
    *pattern = calloc(1, sizeof **pattern);
    if (set->cur_node) {
        LOG_LOCSET(NULL, set->cur_node);
    }
    rc = lys_compile_type_pattern_check(set->ctx, args[1]->val.str, &(*pattern)->code);
    if (set->cur_node) {
        LOG_LOCBACK(0, 1);
    }
    if (rc != LY_SUCCESS) {
        LY_ARRAY_FREE(patterns);
        return rc;
    }

    rc = lyplg_type_validate_patterns(patterns, args[0]->val.str, strlen(args[0]->val.str), &err);
    pcre2_code_free((*pattern)->code);
    free(*pattern);
    LY_ARRAY_FREE(patterns);
    if (rc && (rc != LY_EVALID)) {
        ly_err_print(set->ctx, err);
        ly_err_free(err);
        return rc;
    }

    if (rc == LY_EVALID) {
        ly_err_free(err);
        set_fill_boolean(set, 0);
    } else {
        set_fill_boolean(set, 1);
    }

    return LY_SUCCESS;
}